

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *ws)

{
  long in_RDI;
  
  if (*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x10)) {
    __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x42cd,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
  }
  if (*(ulong *)(in_RDI + 0x20) <= *(ulong *)(in_RDI + 0x28)) {
    *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 0x10);
    ZSTD_cwksp_assert_internal_consistency(ws);
    return;
  }
  __assert_fail("ws->tableValidEnd <= ws->allocStart",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x42ce,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
}

Assistant:

MEM_STATIC void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp* ws)
{
    DEBUGLOG(4, "cwksp: ZSTD_cwksp_mark_tables_dirty");

#if ZSTD_MEMORY_SANITIZER && !defined (ZSTD_MSAN_DONT_POISON_WORKSPACE)
    /* To validate that the table re-use logic is sound, and that we don't
     * access table space that we haven't cleaned, we re-"poison" the table
     * space every time we mark it dirty.
     * Since tableValidEnd space and initOnce space may overlap we don't poison
     * the initOnce portion as it break its promise. This means that this poisoning
     * check isn't always applied fully. */
    {
        size_t size = (BYTE*)ws->tableValidEnd - (BYTE*)ws->objectEnd;
        assert(__msan_test_shadow(ws->objectEnd, size) == -1);
        if((BYTE*)ws->tableValidEnd < (BYTE*)ws->initOnceStart) {
            __msan_poison(ws->objectEnd, size);
        } else {
            assert(ws->initOnceStart >= ws->objectEnd);
            __msan_poison(ws->objectEnd, (BYTE*)ws->initOnceStart - (BYTE*)ws->objectEnd);
        }
    }
#endif

    assert(ws->tableValidEnd >= ws->objectEnd);
    assert(ws->tableValidEnd <= ws->allocStart);
    ws->tableValidEnd = ws->objectEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
}